

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

ggml_tensor * __thiscall
llama_model_loader::check_tensor_dims
          (llama_model_loader *this,string *name,vector<long,_std::allocator<long>_> *ne,
          bool required)

{
  ulong uVar1;
  runtime_error *prVar2;
  undefined8 uVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte in_CL;
  vector<long,_std::allocator<long>_> *in_RDX;
  ggml_tensor *in_stack_00000038;
  vector<long,_std::allocator<long>_> *in_stack_00000058;
  size_t i;
  bool is_ok;
  ggml_tensor *cur;
  char *in_stack_ffffffffffffff00;
  llama_model_loader *in_stack_ffffffffffffff08;
  string local_88 [32];
  ulong local_68;
  byte local_5e;
  undefined1 local_5d;
  string local_50 [32];
  ggml_tensor *local_30;
  byte local_21;
  vector<long,_std::allocator<long>_> *local_20;
  ggml_tensor *local_8;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  std::__cxx11::string::c_str();
  local_30 = get_tensor_meta(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  if (local_30 == (ggml_tensor *)0x0) {
    if ((local_21 & 1) != 0) {
      local_5d = 1;
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar3 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_50,"%s: tensor \'%s\' not found","check_tensor_dims",uVar3);
      std::runtime_error::runtime_error(prVar2,local_50);
      local_5d = 0;
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_8 = (ggml_tensor *)0x0;
  }
  else {
    local_5e = 1;
    for (local_68 = 0; uVar1 = local_68, local_68 < 4; local_68 = local_68 + 1) {
      sVar4 = std::vector<long,_std::allocator<long>_>::size(local_20);
      if (uVar1 < sVar4) {
        pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](local_20,local_68);
        if (*pvVar5 == local_30->ne[local_68]) goto LAB_004510ed;
LAB_0045112c:
        local_5e = 0;
        break;
      }
LAB_004510ed:
      uVar1 = local_68;
      sVar4 = std::vector<long,_std::allocator<long>_>::size(local_20);
      if ((sVar4 <= uVar1) && (local_30->ne[local_68] != 1)) goto LAB_0045112c;
    }
    if ((local_5e & 1) == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar3 = std::__cxx11::string::c_str();
      llama_format_tensor_shape_abi_cxx11_(in_stack_00000058);
      uVar6 = std::__cxx11::string::c_str();
      llama_format_tensor_shape_abi_cxx11_(in_stack_00000038);
      uVar7 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_88,"%s: tensor \'%s\' has wrong shape; expected %s, got %s",
                        "check_tensor_dims",uVar3,uVar6,uVar7);
      std::runtime_error::runtime_error(prVar2,local_88);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

const struct ggml_tensor * llama_model_loader::check_tensor_dims(const std::string & name, const std::vector<int64_t> & ne, bool required) const {
    const struct ggml_tensor * cur = get_tensor_meta(name.c_str());

    if (cur == NULL) {
        if (!required) {
            return NULL;
        }
        throw std::runtime_error(format("%s: tensor '%s' not found", __func__, name.c_str()));
    }

    {
        bool is_ok = true;
        for (size_t i = 0; i < GGML_MAX_DIMS; ++i) {
            if ((i < ne.size() && ne[i] != cur->ne[i]) || (i >= ne.size() && cur->ne[i] != 1)) {
                is_ok = false;
                break;
            }
        }
        if (!is_ok) {
            throw std::runtime_error(
                    format("%s: tensor '%s' has wrong shape; expected %s, got %s",
                        __func__, name.c_str(),
                        llama_format_tensor_shape(ne).c_str(),
                        llama_format_tensor_shape(cur).c_str()));
        }
    }

    return cur;
}